

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternGrow(xmlPatternPtr comp)

{
  xmlStepOpPtr pxVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = comp->maxStep;
  if (iVar2 < 1) {
    uVar4 = 10;
  }
  else {
    uVar4 = 0xffffffff;
    if (iVar2 < 1000000000) {
      uVar3 = iVar2 + 1U >> 1;
      uVar4 = uVar3 + iVar2;
      if ((int)(1000000000 - uVar3) < iVar2) {
        uVar4 = 1000000000;
      }
    }
  }
  iVar2 = -1;
  if ((-1 < (int)uVar4) &&
     (pxVar1 = (xmlStepOpPtr)(*xmlRealloc)(comp->steps,(ulong)uVar4 * 0x18),
     pxVar1 != (xmlStepOpPtr)0x0)) {
    comp->steps = pxVar1;
    comp->maxStep = uVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlPatternGrow(xmlPatternPtr comp) {
    xmlStepOpPtr temp;
    int newSize;

    newSize = xmlGrowCapacity(comp->maxStep, sizeof(temp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(comp->steps, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    comp->steps = temp;
    comp->maxStep = newSize;

    return(0);
}